

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int read_function_entry(backtrace_state *state,dwarf_data *ddata,unit *u,uintptr_t base,
                       dwarf_buf *unit_buf,line_header *lhdr,backtrace_error_callback error_callback
                       ,void *data,function_vector *vec_function,function_vector *vec_inlined)

{
  dwarf_attribute dVar1;
  function_addrs *pfVar2;
  int iVar3;
  uint64_t code_00;
  abbrev *paVar4;
  char *pcVar5;
  long *plVar6;
  bool bVar7;
  function_addrs *faddrs;
  function_addrs *p;
  function_vector fvec;
  char *s;
  char *name;
  attr_val val;
  undefined1 local_c0 [4];
  int have_linkage_name;
  pcrange pcrange;
  size_t i;
  function_vector *vec;
  function *function;
  int is_function;
  abbrev *abbrev;
  uint64_t code;
  line_header *lhdr_local;
  dwarf_buf *unit_buf_local;
  uintptr_t base_local;
  unit *u_local;
  dwarf_data *ddata_local;
  backtrace_state *state_local;
  
  unit_buf_local = (dwarf_buf *)base;
  base_local = (uintptr_t)u;
  u_local = (unit *)ddata;
  ddata_local = (dwarf_data *)state;
  do {
    if (unit_buf->left == 0) {
      return 1;
    }
    code_00 = read_uleb128(unit_buf);
    if (code_00 == 0) {
      return 1;
    }
    paVar4 = lookup_abbrev((abbrevs *)(base_local + 0x70),code_00,error_callback,data);
    if (paVar4 == (abbrev *)0x0) {
      return 0;
    }
    bVar7 = true;
    if ((paVar4->tag != DW_TAG_subprogram) && (bVar7 = true, paVar4->tag != DW_TAG_entry_point)) {
      bVar7 = paVar4->tag == DW_TAG_inlined_subroutine;
    }
    if (paVar4->tag == DW_TAG_inlined_subroutine) {
      i = (size_t)vec_inlined;
    }
    else {
      i = (size_t)vec_function;
    }
    vec = (function_vector *)0x0;
    if (bVar7) {
      vec = (function_vector *)
            tcmalloc_backtrace_alloc((backtrace_state *)ddata_local,0x28,error_callback,data);
      if (vec == (function_vector *)0x0) {
        return 0;
      }
      memset(vec,0,0x28);
    }
    memset(local_c0,0,0x38);
    val.u.uint._4_4_ = 0;
    pcrange.have_ranges = 0;
    pcrange.ranges_is_index = 0;
    for (; (ulong)pcrange._48_8_ < paVar4->num_attrs; pcrange._48_8_ = pcrange._48_8_ + 1) {
      iVar3 = read_attribute(paVar4->attrs[pcrange._48_8_].form,paVar4->attrs[pcrange._48_8_].val,
                             unit_buf,*(int *)(base_local + 0x2c),*(int *)(base_local + 0x28),
                             *(int *)(base_local + 0x30),(dwarf_sections *)&u_local->lineoff,
                             (dwarf_data *)u_local->unit_data_len,(attr_val *)&name);
      if (iVar3 == 0) {
        return 0;
      }
      if (((paVar4->tag == DW_TAG_compile_unit) || (paVar4->tag == DW_TAG_skeleton_unit)) &&
         (paVar4->attrs[pcrange._48_8_].name == DW_AT_low_pc)) {
        if ((int)name == 1) {
          unit_buf_local = (dwarf_buf *)val._0_8_;
        }
        else if (((int)name == 2) &&
                (iVar3 = resolve_addr_index((dwarf_sections *)&u_local->lineoff,
                                            *(uint64_t *)(base_local + 0x48),
                                            *(int *)(base_local + 0x30),u_local[1].version,val._0_8_
                                            ,error_callback,data,(uintptr_t *)&unit_buf_local),
                iVar3 == 0)) {
          return 0;
        }
      }
      if (bVar7) {
        dVar1 = paVar4->attrs[pcrange._48_8_].name;
        if (dVar1 == DW_AT_name) {
          if (((vec->vec).base == (void *)0x0) &&
             (iVar3 = resolve_string((dwarf_sections *)&u_local->lineoff,*(int *)(base_local + 0x2c)
                                     ,u_local[1].version,*(uint64_t *)(base_local + 0x40),
                                     (attr_val *)&name,error_callback,data,(char **)vec), iVar3 == 0
             )) {
            return 0;
          }
        }
        else if (dVar1 - DW_AT_low_pc < 2) {
LAB_00160df0:
          update_pcrange(paVar4->attrs + pcrange._48_8_,(attr_val *)&name,(pcrange *)local_c0);
        }
        else if ((dVar1 == DW_AT_abstract_origin) || (dVar1 == DW_AT_specification)) {
          if ((val.u.uint._4_4_ == 0) &&
             (pcVar5 = read_referenced_name_from_attr
                                 ((dwarf_data *)u_local,(unit *)base_local,
                                  paVar4->attrs + pcrange._48_8_,(attr_val *)&name,error_callback,
                                  data), pcVar5 != (char *)0x0)) {
            (vec->vec).base = pcVar5;
          }
        }
        else {
          if (dVar1 == DW_AT_ranges) goto LAB_00160df0;
          if (dVar1 == DW_AT_call_file) {
            if ((int)name == 3) {
              if (lhdr->filenames_count <= (ulong)val._0_8_) {
                dwarf_buf_error(unit_buf,"invalid file number in DW_AT_call_file attribute",0);
                return 0;
              }
              (vec->vec).size = (size_t)lhdr->filenames[val._0_8_];
            }
          }
          else if (dVar1 == DW_AT_call_line) {
            if ((int)name == 3) {
              *(attr_val_encoding *)&(vec->vec).alc = val.encoding;
            }
          }
          else if ((dVar1 == DW_AT_linkage_name) || (dVar1 == DW_AT_MIPS_linkage_name)) {
            fvec.count = 0;
            iVar3 = resolve_string((dwarf_sections *)&u_local->lineoff,*(int *)(base_local + 0x2c),
                                   u_local[1].version,*(uint64_t *)(base_local + 0x40),
                                   (attr_val *)&name,error_callback,data,(char **)&fvec.count);
            if (iVar3 == 0) {
              return 0;
            }
            if (fvec.count != 0) {
              (vec->vec).base = (void *)fvec.count;
              val.u.uint._4_4_ = 1;
            }
          }
        }
      }
    }
    if ((bVar7) && ((vec->vec).base == (void *)0x0)) {
      tcmalloc_backtrace_free((backtrace_state *)ddata_local,vec,0x28,error_callback,data);
      bVar7 = false;
    }
    if (bVar7) {
      if (((int)pcrange.ranges == 0) && (((int)pcrange.lowpc == 0 || ((int)pcrange.highpc == 0)))) {
        tcmalloc_backtrace_free((backtrace_state *)ddata_local,vec,0x28,error_callback,data);
        bVar7 = false;
      }
      else {
        iVar3 = add_ranges((backtrace_state *)ddata_local,(dwarf_sections *)&u_local->lineoff,
                           (libbacktrace_base_address)u_local->unit_data_offset,u_local[1].version,
                           (unit *)base_local,(uintptr_t)unit_buf_local,(pcrange *)local_c0,
                           add_function_range,vec,error_callback,data,(void *)i);
        if (iVar3 == 0) {
          return 0;
        }
      }
    }
    if (paVar4->has_children != 0) {
      if (bVar7) {
        memset(&p,0,0x20);
        iVar3 = read_function_entry((backtrace_state *)ddata_local,(dwarf_data *)u_local,
                                    (unit *)base_local,(uintptr_t)unit_buf_local,unit_buf,lhdr,
                                    error_callback,data,vec_function,(function_vector *)&p);
        if (iVar3 == 0) {
          return 0;
        }
        if (fvec.vec.alc != 0) {
          plVar6 = (long *)tcmalloc_backtrace_vector_grow
                                     ((backtrace_state *)ddata_local,0x18,error_callback,data,
                                      (backtrace_vector *)&p);
          if (plVar6 == (long *)0x0) {
            return 0;
          }
          *plVar6 = 0;
          *plVar6 = *plVar6 + -1;
          plVar6[1] = *plVar6;
          plVar6[2] = 0;
          iVar3 = tcmalloc_backtrace_vector_release
                            ((backtrace_state *)ddata_local,(backtrace_vector *)&p,error_callback,
                             data);
          pfVar2 = p;
          if (iVar3 == 0) {
            return 0;
          }
          tcmalloc_backtrace_qsort(p,fvec.vec.alc,0x18,function_addrs_compare);
          vec->count = (size_t)pfVar2;
          vec[1].vec.base = (void *)fvec.vec.alc;
        }
      }
      else {
        iVar3 = read_function_entry((backtrace_state *)ddata_local,(dwarf_data *)u_local,
                                    (unit *)base_local,(uintptr_t)unit_buf_local,unit_buf,lhdr,
                                    error_callback,data,vec_function,vec_inlined);
        if (iVar3 == 0) {
          return 0;
        }
      }
    }
  } while( true );
}

Assistant:

static int
read_function_entry (struct backtrace_state *state, struct dwarf_data *ddata,
		     struct unit *u, uintptr_t base, struct dwarf_buf *unit_buf,
		     const struct line_header *lhdr,
		     backtrace_error_callback error_callback, void *data,
		     struct function_vector *vec_function,
		     struct function_vector *vec_inlined)
{
  while (unit_buf->left > 0)
    {
      uint64_t code;
      const struct abbrev *abbrev;
      int is_function;
      struct function *function;
      struct function_vector *vec;
      size_t i;
      struct pcrange pcrange;
      int have_linkage_name;

      code = read_uleb128 (unit_buf);
      if (code == 0)
	return 1;

      abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
      if (abbrev == NULL)
	return 0;

      is_function = (abbrev->tag == DW_TAG_subprogram
		     || abbrev->tag == DW_TAG_entry_point
		     || abbrev->tag == DW_TAG_inlined_subroutine);

      if (abbrev->tag == DW_TAG_inlined_subroutine)
	vec = vec_inlined;
      else
	vec = vec_function;

      function = NULL;
      if (is_function)
	{
	  function = ((struct function *)
		      backtrace_alloc (state, sizeof *function,
				       error_callback, data));
	  if (function == NULL)
	    return 0;
	  memset (function, 0, sizeof *function);
	}

      memset (&pcrange, 0, sizeof pcrange);
      have_linkage_name = 0;
      for (i = 0; i < abbrev->num_attrs; ++i)
	{
	  struct attr_val val;

	  if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			       unit_buf, u->is_dwarf64, u->version,
			       u->addrsize, &ddata->dwarf_sections,
			       ddata->altlink, &val))
	    return 0;

	  /* The compile unit sets the base address for any address
	     ranges in the function entries.  */
	  if ((abbrev->tag == DW_TAG_compile_unit
	       || abbrev->tag == DW_TAG_skeleton_unit)
	      && abbrev->attrs[i].name == DW_AT_low_pc)
	    {
	      if (val.encoding == ATTR_VAL_ADDRESS)
		base = (uintptr_t) val.u.uint;
	      else if (val.encoding == ATTR_VAL_ADDRESS_INDEX)
		{
		  if (!resolve_addr_index (&ddata->dwarf_sections,
					   u->addr_base, u->addrsize,
					   ddata->is_bigendian, val.u.uint,
					   error_callback, data, &base))
		    return 0;
		}
	    }

	  if (is_function)
	    {
	      switch (abbrev->attrs[i].name)
		{
		case DW_AT_call_file:
		  if (val.encoding == ATTR_VAL_UINT)
		    {
		      if (val.u.uint >= lhdr->filenames_count)
			{
			  dwarf_buf_error (unit_buf,
					   ("invalid file number in "
					    "DW_AT_call_file attribute"),
					   0);
			  return 0;
			}
		      function->caller_filename = lhdr->filenames[val.u.uint];
		    }
		  break;

		case DW_AT_call_line:
		  if (val.encoding == ATTR_VAL_UINT)
		    function->caller_lineno = val.u.uint;
		  break;

		case DW_AT_abstract_origin:
		case DW_AT_specification:
		  /* Second name preference: override DW_AT_name, don't override
		     DW_AT_linkage_name.  */
		  if (have_linkage_name)
		    break;
		  {
		    const char *name;

		    name
		      = read_referenced_name_from_attr (ddata, u,
							&abbrev->attrs[i], &val,
							error_callback, data);
		    if (name != NULL)
		      function->name = name;
		  }
		  break;

		case DW_AT_name:
		  /* Third name preference: don't override.  */
		  if (function->name != NULL)
		    break;
		  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				       ddata->is_bigendian,
				       u->str_offsets_base, &val,
				       error_callback, data, &function->name))
		    return 0;
		  break;

		case DW_AT_linkage_name:
		case DW_AT_MIPS_linkage_name:
		  /* First name preference: override all.  */
		  {
		    const char *s;

		    s = NULL;
		    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
					 ddata->is_bigendian,
					 u->str_offsets_base, &val,
					 error_callback, data, &s))
		      return 0;
		    if (s != NULL)
		      {
			function->name = s;
			have_linkage_name = 1;
		      }
		  }
		  break;

		case DW_AT_low_pc: case DW_AT_high_pc: case DW_AT_ranges:
		  update_pcrange (&abbrev->attrs[i], &val, &pcrange);
		  break;

		default:
		  break;
		}
	    }
	}

      /* If we couldn't find a name for the function, we have no use
	 for it.  */
      if (is_function && function->name == NULL)
	{
	  backtrace_free (state, function, sizeof *function,
			  error_callback, data);
	  is_function = 0;
	}

      if (is_function)
	{
	  if (pcrange.have_ranges
	      || (pcrange.have_lowpc && pcrange.have_highpc))
	    {
	      if (!add_ranges (state, &ddata->dwarf_sections,
			       ddata->base_address, ddata->is_bigendian,
			       u, base, &pcrange, add_function_range,
			       (void *) function, error_callback, data,
			       (void *) vec))
		return 0;
	    }
	  else
	    {
	      backtrace_free (state, function, sizeof *function,
			      error_callback, data);
	      is_function = 0;
	    }
	}

      if (abbrev->has_children)
	{
	  if (!is_function)
	    {
	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					vec_inlined))
		return 0;
	    }
	  else
	    {
	      struct function_vector fvec;

	      /* Gather any information for inlined functions in
		 FVEC.  */

	      memset (&fvec, 0, sizeof fvec);

	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					&fvec))
		return 0;

	      if (fvec.count > 0)
		{
		  struct function_addrs *p;
		  struct function_addrs *faddrs;

		  /* Allocate a trailing entry, but don't include it
		     in fvec.count.  */
		  p = ((struct function_addrs *)
		       backtrace_vector_grow (state,
					      sizeof (struct function_addrs),
					      error_callback, data,
					      &fvec.vec));
		  if (p == NULL)
		    return 0;
		  p->low = 0;
		  --p->low;
		  p->high = p->low;
		  p->function = NULL;

		  if (!backtrace_vector_release (state, &fvec.vec,
						 error_callback, data))
		    return 0;

		  faddrs = (struct function_addrs *) fvec.vec.base;
		  backtrace_qsort (faddrs, fvec.count,
				   sizeof (struct function_addrs),
				   function_addrs_compare);

		  function->function_addrs = faddrs;
		  function->function_addrs_count = fvec.count;
		}
	    }
	}
    }

  return 1;
}